

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Connector.cpp
# Opt level: O1

void __thiscall
brynet::net::ConnectorWorkInfo::processConnect(ConnectorWorkInfo *this,AsyncConnectAddr *addr)

{
  ushort uVar1;
  int iVar2;
  int *piVar3;
  mapped_type *pmVar4;
  sock clientfd;
  sockaddr_in server_addr;
  ConnectingInfo ci;
  key_type local_94;
  undefined1 local_90 [10];
  ushort local_86;
  undefined1 local_84 [12];
  rep local_78;
  rep rStack_70;
  _Any_data local_68;
  code *local_58;
  undefined8 uStack_50;
  _Any_data local_48;
  code *local_38;
  undefined8 uStack_30;
  
  local_94 = -1;
  base::InitSocket();
  local_94 = base::SocketCreate(2,1,0);
  if (local_94 != -1) {
    base::SocketNonblock(local_94);
    local_90._8_2_ = 2;
    inet_pton(2,(addr->mIP)._M_dataplus._M_p,local_84);
    uVar1 = (ushort)addr->mPort;
    local_86 = uVar1 << 8 | uVar1 >> 8;
    iVar2 = connect(local_94,(sockaddr *)(local_90 + 8),0x10);
    if (iVar2 == 0) {
      if ((addr->mSuccessCB).super__Function_base._M_manager == (_Manager_type)0x0) {
        return;
      }
      TcpSocket::Create((TcpSocket *)local_90,local_94,false);
      if ((addr->mSuccessCB).super__Function_base._M_manager != (_Manager_type)0x0) {
        (*(addr->mSuccessCB)._M_invoker)
                  ((_Any_data *)&addr->mSuccessCB,
                   (unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter> *)
                   local_90);
        if ((tuple<brynet::net::TcpSocket_*,_brynet::net::TcpSocket::TcpSocketDeleter>)
            local_90._0_8_ == (_Head_base<0UL,_brynet::net::TcpSocket_*,_false>)0x0) {
          return;
        }
        (**(code **)(*(_func_int **)local_90._0_8_ + 8))();
        return;
      }
      std::__throw_bad_function_call();
    }
    piVar3 = __errno_location();
    if (*piVar3 == 0x73) {
      local_38 = (code *)0x0;
      uStack_30 = 0;
      local_48._M_unused._M_object = (void *)0x0;
      local_48._8_8_ = 0;
      local_58 = (code *)0x0;
      uStack_50 = 0;
      local_68._M_unused._M_object = (void *)0x0;
      local_68._8_8_ = 0;
      local_78 = 0;
      rStack_70 = 0;
      local_78 = std::chrono::_V2::steady_clock::now();
      std::
      function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
      ::operator=((function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
                   *)&local_68,&addr->mSuccessCB);
      std::function<void_()>::operator=((function<void_()> *)&local_48,&addr->mFailedCB);
      rStack_70 = (addr->mTimeout).__r;
      pmVar4 = std::
               map<int,_brynet::net::ConnectorWorkInfo::ConnectingInfo,_std::less<int>,_std::allocator<std::pair<const_int,_brynet::net::ConnectorWorkInfo::ConnectingInfo>_>_>
               ::operator[](&this->mConnectingInfos,&local_94);
      (pmVar4->startConnectTime).__d.__r = local_78;
      (pmVar4->timeout).__r = rStack_70;
      std::
      function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
      ::operator=(&pmVar4->successCB,
                  (function<void_(std::unique_ptr<brynet::net::TcpSocket,_brynet::net::TcpSocket::TcpSocketDeleter>)>
                   *)&local_68);
      std::function<void_()>::operator=(&pmVar4->failedCB,(function<void_()> *)&local_48);
      ox_fdset_add((this->mFDSet)._M_t.
                   super___uniq_ptr_impl<fdset_s,_brynet::net::ConnectorWorkInfo::FDSetDeleter>._M_t
                   .super__Tuple_impl<0UL,_fdset_s_*,_brynet::net::ConnectorWorkInfo::FDSetDeleter>.
                   super__Head_base<0UL,_fdset_s_*,_false>._M_head_impl,local_94,2);
      if (local_38 != (code *)0x0) {
        (*local_38)(&local_48,&local_48,__destroy_functor);
      }
      if (local_58 == (code *)0x0) {
        return;
      }
      (*local_58)(&local_68,&local_68,__destroy_functor);
      return;
    }
    base::SocketClose(local_94);
    local_94 = -1;
  }
  if ((addr->mFailedCB).super__Function_base._M_manager != (_Manager_type)0x0) {
    (*(addr->mFailedCB)._M_invoker)((_Any_data *)&addr->mFailedCB);
  }
  return;
}

Assistant:

void ConnectorWorkInfo::processConnect(const AsyncConnectAddr& addr)
{
    struct sockaddr_in server_addr;
    sock clientfd = SOCKET_ERROR;

#if defined PLATFORM_WINDOWS
    int check_error = WSAEWOULDBLOCK;
#else
    int check_error = EINPROGRESS;
#endif
    int n = 0;

    brynet::net::base::InitSocket();

    clientfd = brynet::net::base::SocketCreate(AF_INET, SOCK_STREAM, 0);
    if (clientfd == SOCKET_ERROR)
    {
        goto FAILED;
    }

    brynet::net::base::SocketNonblock(clientfd);
    server_addr.sin_family = AF_INET;
    inet_pton(AF_INET, addr.getIP().c_str(), &server_addr.sin_addr.s_addr);
    server_addr.sin_port = htons(addr.getPort());

    n = connect(clientfd, (struct sockaddr*)&server_addr, sizeof(struct sockaddr));
    if (n == 0)
    {
        goto SUCCESS;
    }

    if (check_error != sErrno)
    {
        brynet::net::base::SocketClose(clientfd);
        clientfd = SOCKET_ERROR;
        goto FAILED;
    }

    {
        ConnectingInfo ci;
        ci.startConnectTime = std::chrono::steady_clock::now();
        ci.successCB = addr.getSuccessCB();
        ci.failedCB = addr.getFailedCB();
        ci.timeout = addr.getTimeout();

        mConnectingInfos[clientfd] = ci;
        ox_fdset_add(mFDSet.get(), clientfd, WriteCheck);
    }
    return;

SUCCESS:
    if (addr.getSuccessCB() != nullptr)
    {
        addr.getSuccessCB()(TcpSocket::Create(clientfd, false));
    }
    return;

FAILED:
    if (addr.getFailedCB() != nullptr)
    {
        addr.getFailedCB()();
    }
}